

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::request_prevote(raft_server *this)

{
  atomic<int> *paVar1;
  srv_role sVar2;
  int32 iVar3;
  element_type *peVar4;
  __int_type _Var5;
  _func_int **pp_Var6;
  element_type *peVar7;
  bool bVar8;
  int iVar9;
  int32 iVar10;
  int iVar11;
  uint64_t uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar13;
  undefined4 extraout_var_01;
  _func_int **pp_Var14;
  undefined4 extraout_var_02;
  int iVar15;
  long lVar16;
  element_type *peVar17;
  _Hash_node_base *p_Var18;
  byte bVar19;
  ptr<raft_params> clone;
  undefined1 local_c8 [16];
  ptr<peer> pp;
  undefined1 local_a8 [16];
  ptr<srv_config> s_config;
  ptr<raft_params> params;
  ptr<peer> local_68;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  ptr<cluster_config> c_config;
  
  bVar19 = 0;
  context::get_params((context *)&params);
  get_config((raft_server *)&c_config);
  for (p_Var18 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var18 != (_Hash_node_base *)0x0;
      p_Var18 = p_Var18->_M_nxt) {
    pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)p_Var18[2]._M_nxt;
    pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var18[3]._M_nxt;
    if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
      }
    }
    bVar8 = is_regular_member(this,&pp);
    if (bVar8) {
      cluster_config::get_server
                ((cluster_config *)&s_config,
                 (int)c_config.
                      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (((this->hb_alive_)._M_base._M_i & 1U) == 0) {
          bVar8 = peer::need_to_reconnect
                            (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          uVar12 = timer_helper::get_us
                             (&(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->last_active_timer_);
          if (DAT_005e1998 *
              (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              heart_beat_interval_ < (int)(uVar12 / 1000)) {
            peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((peVar4 != (element_type *)0x0) && (iVar9 = (*peVar4->_vptr_logger[7])(), 2 < iVar9)
               ) {
              peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&clone,
                         "connection to peer %d is not active long time: %d ms, need reconnection for prevote"
                         ,(ulong)(uint)(((pp.
                                          super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->config_).
                                        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->id_,uVar12 / 1000 & 0xffffffff);
              (*peVar4->_vptr_logger[8])
                        (peVar4,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"request_prevote",0x49,&clone);
              if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)local_c8) {
                operator_delete(clone.
                                super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
              }
            }
          }
          else if (!bVar8) goto LAB_001aa463;
        }
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar4 != (element_type *)0x0) && (iVar9 = (*peVar4->_vptr_logger[7])(), 3 < iVar9)) {
          peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&clone,"reset RPC client for peer %d",
                     (ulong)(uint)(s_config.
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
          (*peVar4->_vptr_logger[8])
                    (peVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"request_prevote",0x4f,&clone);
          if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_c8) {
            operator_delete(clone.
                            super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
          }
        }
        peer::recreate_rpc(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &s_config,
                           (this->ctx_)._M_t.
                           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                           .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl);
      }
LAB_001aa463:
      if (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  iVar10 = get_quorum_for_election(this);
  iVar9 = (this->pre_vote_).live_.super___atomic_base<int>._M_i;
  iVar11 = (this->pre_vote_).dead_.super___atomic_base<int>._M_i;
  iVar15 = iVar11 + iVar9;
  if (iVar15 != 0 && SCARRY4(iVar11,iVar9) == iVar15 < 0) {
    if (iVar10 < (this->pre_vote_).dead_.super___atomic_base<int>._M_i +
                 (this->pre_vote_).live_.super___atomic_base<int>._M_i) {
      LOCK();
      (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i = 0;
      UNLOCK();
    }
    else {
      LOCK();
      paVar1 = &(this->pre_vote_).failure_count_;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar4 != (element_type *)0x0) && (iVar9 = (*peVar4->_vptr_logger[7])(), 2 < iVar9)) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "total %d nodes (including this node) responded for pre-vote (term %lu, live %d, dead %d), at least %d nodes should respond. failure count %d"
                   ,(ulong)(uint)((this->pre_vote_).dead_.super___atomic_base<int>._M_i +
                                 (this->pre_vote_).live_.super___atomic_base<int>._M_i),
                   (this->pre_vote_).term_,
                   (ulong)(uint)(this->pre_vote_).live_.super___atomic_base<int>._M_i,
                   (ulong)(uint)(this->pre_vote_).dead_.super___atomic_base<int>._M_i,
                   (ulong)(iVar10 + 1),
                   (ulong)(uint)(this->pre_vote_).failure_count_.super___atomic_base<int>._M_i);
        (*peVar4->_vptr_logger[8])
                  (peVar4,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"request_prevote",0x62,&clone);
        if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_c8) {
          operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        }
      }
    }
  }
  iVar10 = get_num_voting_members(this);
  if (((iVar10 == 2) &&
      ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       auto_adjust_quorum_for_small_cluster_ != false)) &&
     (DAT_005e19a0 < (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i)) {
    peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar4 != (element_type *)0x0) && (iVar9 = (*peVar4->_vptr_logger[7])(), 2 < iVar9)) {
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&clone,
                 "2-node cluster\'s pre-vote is failing long time, adjust quorum to 1");
      (*peVar4->_vptr_logger[8])
                (peVar4,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_prevote",0x6d,&clone);
      if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_c8) {
        operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      }
    }
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
    (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c4058;
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    peVar17 = clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    for (lVar16 = 0x1a; lVar16 != 0; lVar16 = lVar16 + -1) {
      peVar17->election_timeout_upper_bound_ =
           (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           election_timeout_upper_bound_;
      params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((long)params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           + (ulong)bVar19 * -8 + 4);
      peVar17 = (element_type *)((long)peVar17 + (ulong)bVar19 * -8 + 4);
    }
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 1;
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_weak_count = 1;
    context::set_params((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,&clone);
    if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  LOCK();
  (this->hb_alive_)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->leader_).super___atomic_base<int>._M_i = -1;
  UNLOCK();
  LOCK();
  (this->role_)._M_i = candidate;
  UNLOCK();
  (this->pre_vote_).term_ =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->pre_vote_).done_._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).dead_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).live_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  paVar1 = &(this->pre_vote_).dead_;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  if (this->my_priority_ < this->target_priority_) {
    bVar8 = check_cond_for_zp_election(this);
    peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!bVar8) {
      if ((peVar4 != (element_type *)0x0) && (iVar9 = (*peVar4->_vptr_logger[7])(), 3 < iVar9)) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "[PRIORITY] will not initiate pre-vote due to priority: target %d, mine %d",
                   (ulong)(uint)this->target_priority_,(ulong)(uint)this->my_priority_);
        (*peVar4->_vptr_logger[8])
                  (peVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"request_prevote",0x80,&clone);
        if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_c8) {
          operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        }
      }
      restart_election_timer(this);
      goto LAB_001aacda;
    }
    if ((peVar4 != (element_type *)0x0) && (iVar9 = (*peVar4->_vptr_logger[7])(), 3 < iVar9)) {
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&clone,"[PRIORITY] temporarily allow election for zero-priority member");
      (*peVar4->_vptr_logger[8])
                (peVar4,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_prevote",0x7d,&clone);
      if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_c8) {
        operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      }
    }
  }
  peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar4 != (element_type *)0x0) && (iVar9 = (*peVar4->_vptr_logger[7])(), 3 < iVar9)) {
    peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar10 = this->id_;
    sVar2 = (this->role_)._M_i;
    if (sVar2 == leader) {
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
      local_a8._0_7_ = 0x72656461656c;
    }
    else if (sVar2 == candidate) {
      local_a8._0_8_ = (element_type *)0x74616469646e6163;
      local_a8[8] = 0x65;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9;
      local_a8[9] = 0;
    }
    else if (sVar2 == follower) {
      local_a8._0_8_ = (element_type *)0x7265776f6c6c6f66;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
      local_a8[8] = 0;
    }
    else {
      local_a8._0_8_ = (element_type *)0x4e574f4e4b4e55;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
    }
    _Var5 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8;
    iVar9 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    iVar11 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_log_store[2])();
    uVar13 = term_for_log(this,CONCAT44(extraout_var_00,iVar11) - 1);
    msg_if_given_abi_cxx11_
              ((string *)&clone,
               "[PRE-VOTE INIT] my id %d, my role %s, term %lu, log idx %lu, log term %lu, priority (target %d / mine %d)\n"
               ,iVar10,(element_type *)local_a8,_Var5,CONCAT44(extraout_var,iVar9) + -1,uVar13,
               (ulong)(uint)this->target_priority_,(ulong)(uint)this->my_priority_);
    (*peVar4->_vptr_logger[8])
              (peVar4,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"request_prevote",0x8b,&clone);
    if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_c8) {
      operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
    if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_a8) {
      operator_delete(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  p_Var18 = (this->peers_)._M_h._M_before_begin._M_nxt;
  if (p_Var18 != (_Hash_node_base *)0x0) {
    local_58 = &this->resp_handler_;
    local_48 = (element_type *)&PTR___Sp_counted_ptr_inplace_005c40a8;
    local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__req_msg_005c40f8;
    do {
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var18[2]._M_nxt;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var18[3]._M_nxt;
      if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar8 = is_regular_member(this,&pp);
      if (bVar8) {
        _Var5 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
        iVar10 = (((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_
                  ).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
        iVar9 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        pp_Var14 = (_func_int **)term_for_log(this,CONCAT44(extraout_var_01,iVar9) - 1);
        iVar9 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        pp_Var6 = (_func_int **)(this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
        (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count = 1;
        (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = 1;
        (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base = (_func_int **)local_48;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 1);
        iVar3 = this->id_;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = (int)_Var5;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_weak_count = (int)(_Var5 >> 0x20);
        *(undefined4 *)
         &s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[2]._vptr__Sp_counted_base = 0x14;
        *(int32 *)((long)&s_config.
                          super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = iVar3;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._M_use_count = iVar10;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._vptr__Sp_counted_base = (_func_int **)local_50._M_pi;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[3]._vptr__Sp_counted_base = pp_Var14;
        *(long *)&s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[3]._M_use_count = CONCAT44(extraout_var_02,iVar9) + -1;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[4]._vptr__Sp_counted_base = pp_Var6;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[4]._M_use_count = 0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[4]._M_weak_count = 0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[5]._M_use_count = 0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[5]._M_weak_count = 0;
        LOCK();
        bVar8 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                busy_flag_)._M_base._M_i == false;
        if (bVar8) {
          ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->busy_flag_).
          _M_base._M_i = true;
        }
        UNLOCK();
        if (bVar8) {
          local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          peer::send_req(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &local_68,(ptr<req_msg> *)&s_config,(rpc_handler *)local_58);
          if (local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        else {
          peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar4 != (element_type *)0x0) && (iVar9 = (*peVar4->_vptr_logger[7])(), 2 < iVar9))
          {
            peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            peVar7 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&clone,"failed to send prevote request: peer %d (%s) is busy",
                       (ulong)(uint)peVar7->id_,(peVar7->endpoint_)._M_dataplus._M_p);
            (*peVar4->_vptr_logger[8])
                      (peVar4,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"request_prevote",0xa0,&clone);
            if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)local_c8) {
              operator_delete(clone.
                              super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
            }
          }
        }
        if (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
  }
LAB_001aacda:
  if (c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void raft_server::request_prevote() {
    ptr<raft_params> params = ctx_->get_params();
    ptr<cluster_config> c_config = get_config();
    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) continue;
        ptr<srv_config> s_config = c_config->get_server( pp->get_id() );

        if (s_config) {
            bool recreate = false;
            if (hb_alive_) {
                // First pre-vote request: reset RPC client for all peers.
                recreate = true;

            } else {
                // Since second time: reset only if `rpc_` is null.
                recreate = pp->need_to_reconnect();

                // Or if it is not active long time, reconnect as well.
                int32 last_active_time_ms = pp->get_active_timer_us() / 1000;
                if ( last_active_time_ms >
                         params->heart_beat_interval_ *
                             raft_server::raft_limits_.reconnect_limit_ ) {
                    p_wn( "connection to peer %d is not active long time: %d ms, "
                          "need reconnection for prevote",
                          pp->get_id(),
                          last_active_time_ms );
                    recreate = true;
                }
            }

            if (recreate) {
                p_in("reset RPC client for peer %d", s_config->get_id());
                pp->recreate_rpc(s_config, *ctx_);
            }
        }
    }

    int quorum_size = get_quorum_for_election();
    if (pre_vote_.live_ + pre_vote_.dead_ > 0) {
        if (pre_vote_.live_ + pre_vote_.dead_ < quorum_size + 1) {
            // Pre-vote failed due to non-responding voters.
            pre_vote_.failure_count_++;
            p_wn("total %d nodes (including this node) responded for pre-vote "
                 "(term %" PRIu64 ", live %d, dead %d), at least %d nodes should "
                 "respond. failure count %d",
                 pre_vote_.live_.load() + pre_vote_.dead_.load(),
                 pre_vote_.term_,
                 pre_vote_.live_.load(),
                 pre_vote_.dead_.load(),
                 quorum_size + 1,
                 pre_vote_.failure_count_.load());
        } else {
            pre_vote_.failure_count_ = 0;
        }
    }
    int num_voting_members = get_num_voting_members();
    if ( params->auto_adjust_quorum_for_small_cluster_ &&
         num_voting_members == 2 &&
         pre_vote_.failure_count_ > raft_server::raft_limits_.vote_limit_ ) {
        // 2-node cluster's pre-vote failed due to offline node.
        p_wn("2-node cluster's pre-vote is failing long time, "
             "adjust quorum to 1");
        ptr<raft_params> clone = cs_new<raft_params>(*params);
        clone->custom_commit_quorum_size_ = 1;
        clone->custom_election_quorum_size_ = 1;
        ctx_->set_params(clone);
    }

    hb_alive_ = false;
    leader_ = -1;
    role_ = srv_role::candidate;
    pre_vote_.reset(state_->get_term());
    // Count for myself.
    pre_vote_.dead_++;

    if ( my_priority_ < target_priority_ ) {
        if ( check_cond_for_zp_election() ) {
            p_in("[PRIORITY] temporarily allow election for zero-priority member");
        } else {
            p_in("[PRIORITY] will not initiate pre-vote due to priority: "
                 "target %d, mine %d", target_priority_, my_priority_);
            restart_election_timer();
            return;
        }
    }

    p_in("[PRE-VOTE INIT] my id %d, my role %s, term %" PRIu64 ", log idx %" PRIu64 ", "
         "log term %" PRIu64 ", priority (target %d / mine %d)\n",
         id_, srv_role_to_string(role_).c_str(),
         state_->get_term(), log_store_->next_slot() - 1,
         term_for_log(log_store_->next_slot() - 1),
         target_priority_, my_priority_);

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) {
            // Do not send voting request to learner.
            continue;
        }

        ptr<req_msg> req( cs_new<req_msg>
                          ( state_->get_term(),
                            msg_type::pre_vote_request,
                            id_,
                            pp->get_id(),
                            term_for_log(log_store_->next_slot() - 1),
                            log_store_->next_slot() - 1,
                            quick_commit_index_.load() ) );
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_wn("failed to send prevote request: peer %d (%s) is busy",
                 pp->get_id(), pp->get_endpoint().c_str());
        }
    }
}